

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

uint64 mkvmuxer::WriteFrame(IMkvWriter *writer,Frame *frame,Cluster *cluster)

{
  bool bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int64_t timecode;
  IMkvWriter *local_48;
  int64 relative_timecode;
  Cluster *cluster_local;
  Frame *frame_local;
  IMkvWriter *writer_local;
  
  if ((((writer == (IMkvWriter *)0x0) || (frame == (Frame *)0x0)) ||
      (bVar1 = Frame::IsValid(frame), !bVar1)) ||
     ((cluster == (Cluster *)0x0 || (uVar2 = Cluster::timecode_scale(cluster), uVar2 == 0)))) {
    writer_local = (IMkvWriter *)0x0;
  }
  else {
    uVar2 = Frame::timestamp(frame);
    uVar3 = Cluster::timecode_scale(cluster);
    timecode = Cluster::GetRelativeTimecode(cluster,uVar2 / uVar3);
    if ((timecode < 0) || (0x7fff < timecode)) {
      writer_local = (IMkvWriter *)0x0;
    }
    else {
      bVar1 = Frame::CanBeSimpleBlock(frame);
      if (bVar1) {
        local_48 = (IMkvWriter *)anon_unknown_0::WriteSimpleBlock(writer,frame,timecode);
      }
      else {
        uVar2 = Cluster::timecode_scale(cluster);
        local_48 = (IMkvWriter *)anon_unknown_0::WriteBlock(writer,frame,timecode,uVar2);
      }
      writer_local = local_48;
    }
  }
  return (uint64)writer_local;
}

Assistant:

uint64 WriteFrame(IMkvWriter* writer, const Frame* const frame,
                  Cluster* cluster) {
  if (!writer || !frame || !frame->IsValid() || !cluster ||
      !cluster->timecode_scale())
    return 0;

  //  Technically the timecode for a block can be less than the
  //  timecode for the cluster itself (remember that block timecode
  //  is a signed, 16-bit integer).  However, as a simplification we
  //  only permit non-negative cluster-relative timecodes for blocks.
  const int64 relative_timecode = cluster->GetRelativeTimecode(
      frame->timestamp() / cluster->timecode_scale());
  if (relative_timecode < 0 || relative_timecode > kMaxBlockTimecode)
    return 0;

  return frame->CanBeSimpleBlock()
             ? WriteSimpleBlock(writer, frame, relative_timecode)
             : WriteBlock(writer, frame, relative_timecode,
                          cluster->timecode_scale());
}